

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O0

int mriStep_NlsResidual(N_Vector zcor,N_Vector r,void *arkode_mem)

{
  int iVar1;
  N_Vector in_RDI;
  N_Vector X [3];
  realtype c [3];
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  N_Vector in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  N_Vector in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                       (ARKodeMem *)in_stack_ffffffffffffff88,(ARKodeMRIStepMem *)0xee6b7e);
  if (local_4 == 0) {
    N_VLinearSum((realtype)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98,(realtype)in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88,(N_Vector)0xee6bc0);
    iVar1 = (**(code **)(local_30 + 0xa0))
                      (*(undefined8 *)(local_28 + 0x198),*(undefined8 *)(local_28 + 0x108),
                       *(undefined8 *)
                        (*(long *)(local_30 + 0x30) +
                        (long)*(int *)(*(long *)(local_30 + 0x50) +
                                      (long)*(int *)(local_30 + 0x88) * 4) * 8),
                       *(undefined8 *)(local_28 + 0x10));
    *(long *)(local_30 + 0x170) = *(long *)(local_30 + 0x170) + 1;
    if (iVar1 < 0) {
      local_4 = -8;
    }
    else if (iVar1 < 1) {
      iVar1 = N_VLinearCombination
                        (in_stack_ffffffffffffffa4,
                         *(realtype **)
                          (*(long *)(local_30 + 0x30) +
                          (long)*(int *)(*(long *)(local_30 + 0x50) +
                                        (long)*(int *)(local_30 + 0x88) * 4) * 8),
                         *(N_Vector **)(local_30 + 0x70),in_RDI);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = -0x1c;
      }
    }
    else {
      local_4 = 9;
    }
  }
  return local_4;
}

Assistant:

int mriStep_NlsResidual(N_Vector zcor, N_Vector r, void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;
  realtype c[3];
  N_Vector X[3];

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_NlsResidual",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute slow implicit RHS and save for later */
  retval = step_mem->nls_fsi(ark_mem->tcur, ark_mem->ycur,
                             step_mem->Fsi[step_mem->stage_map[step_mem->istage]],
                             ark_mem->user_data);
  step_mem->nfsi++;
  if (retval < 0) return(ARK_RHSFUNC_FAIL);
  if (retval > 0) return(RHSFUNC_RECVR);

  /* compute residual: zcor - gamma*Fsi - sdata */
  c[0] = ONE;
  X[0] = zcor;
  c[1] = -ONE;
  X[1] = step_mem->sdata;
  c[2] = -step_mem->gamma;
  X[2] = step_mem->Fsi[step_mem->stage_map[step_mem->istage]];
  retval = N_VLinearCombination(3, c, X, r);
  if (retval != 0)  return(ARK_VECTOROP_ERR);
  return(ARK_SUCCESS);
}